

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O1

void __thiscall
Js::SimpleTypeHandler<3UL>::SimpleTypeHandler
          (SimpleTypeHandler<3UL> *this,SimpleTypeHandler<3UL> *typeHandler,bool unused)

{
  undefined8 *puVar1;
  PropertyRecord *pPVar2;
  code *pcVar3;
  bool bVar4;
  long lVar5;
  undefined4 *puVar6;
  anon_union_8_2_5e5949cc_for_SimplePropertyDescriptor_1 *paVar7;
  Type *addr;
  
  DynamicTypeHandler::DynamicTypeHandler
            (&this->super_DynamicTypeHandler,3,
             (typeHandler->super_DynamicTypeHandler).inlineSlotCapacity,
             (typeHandler->super_DynamicTypeHandler).offsetOfInlineSlots,'\x01');
  (this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler = (_func_int **)&PTR_GetCppName_01557500
  ;
  this->propertyCount = typeHandler->propertyCount;
  lVar5 = 0x28;
  do {
    puVar1 = (undefined8 *)((long)this->descriptors + lVar5 + -0x28);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined1 *)
     ((long)&(((SimpleTypeHandler<3UL> *)(this->descriptors + -2))->super_DynamicTypeHandler).
             _vptr_DynamicTypeHandler + lVar5) = 7;
    lVar5 = lVar5 + 0x10;
  } while (lVar5 != 0x58);
  if (((typeHandler->super_DynamicTypeHandler).propertyTypes & 0x40) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                ,0x11,"(typeHandler->GetIsInlineSlotCapacityLocked())",
                                "typeHandler->GetIsInlineSlotCapacityLocked()");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  DynamicTypeHandler::SetIsInlineSlotCapacityLocked(&this->super_DynamicTypeHandler);
  if (0 < this->propertyCount) {
    addr = this->descriptors;
    paVar7 = &typeHandler->descriptors[0].field_1;
    lVar5 = 0;
    do {
      pPVar2 = (((Type *)(paVar7 + -1))->Id).ptr;
      Memory::Recycler::WBSetBit((char *)addr);
      (addr->Id).ptr = pPVar2;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
      addr->field_1 = *paVar7;
      lVar5 = lVar5 + 1;
      paVar7 = paVar7 + 2;
      addr = addr + 1;
    } while (lVar5 < this->propertyCount);
  }
  return;
}

Assistant:

SimpleTypeHandler<size>::SimpleTypeHandler(SimpleTypeHandler<size> * typeHandler, bool unused)
        : DynamicTypeHandler(sizeof(descriptors) / sizeof(SimplePropertyDescriptor),
            typeHandler->GetInlineSlotCapacity(), typeHandler->GetOffsetOfInlineSlots()), propertyCount(typeHandler->propertyCount)
    {
        Assert(typeHandler->GetIsInlineSlotCapacityLocked());
        SetIsInlineSlotCapacityLocked();
        for (int i = 0; i < propertyCount; i++)
        {
            descriptors[i] = typeHandler->descriptors[i];
        }
    }